

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_TestParamSet_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  undefined8 *in_RDI;
  uint64_t x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x18;
  uint64_t x17;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x16;
  uint64_t x15;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x14;
  uint64_t x13;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x12;
  uint64_t x11;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x10;
  uint64_t x9;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x8;
  uint64_t x7;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x6;
  uint64_t x5;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x4;
  uint64_t x3;
  fiat_id_GostR3410_2001_TestParamSet_uint1 x2;
  uint64_t x1;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  uint64_t in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  fiat_id_GostR3410_2001_TestParamSet_uint1 in_stack_ffffffffffffff6f;
  uint64_t *in_stack_ffffffffffffff70;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_81;
  uint64_t local_80;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_71;
  uint64_t local_70;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_61;
  uint64_t local_60;
  byte local_51;
  uint64_t local_50;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_41;
  uint64_t local_40;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_31;
  uint64_t local_30;
  fiat_id_GostR3410_2001_TestParamSet_uint1 local_21;
  uint64_t local_20;
  uint64_t *local_18;
  uint64_t *local_10;
  undefined8 *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&local_20,&local_21,'\0',*in_RSI,*in_RDX);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_30,&local_31,local_21,local_10[1],local_18[1]);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_40,&local_41,local_31,local_10[2],local_18[2]);
  fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64
            (&local_50,&local_51,local_41,local_10[3],local_18[3]);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_60,&local_61,'\0',local_20,0x431);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_70,&local_71,local_61,local_30,0);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&local_80,&local_81,local_71,local_40,0);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            ((uint64_t *)&stack0xffffffffffffff70,&stack0xffffffffffffff6f,local_81,local_50,
             0x8000000000000000);
  fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64
            ((uint64_t *)&stack0xffffffffffffff60,&stack0xffffffffffffff5f,in_stack_ffffffffffffff6f
             ,(ulong)local_51,0);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  *local_8 = local_b0;
  local_8[1] = local_b8;
  local_8[2] = local_c0;
  local_8[3] = local_c8;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_add(uint64_t out1[4],
                                                    const uint64_t arg1[4],
                                                    const uint64_t arg2[4]) {
    uint64_t x1;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x2;
    uint64_t x3;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x4;
    uint64_t x5;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x6;
    uint64_t x7;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x8;
    uint64_t x9;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x10;
    uint64_t x11;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x1, &x2, 0x0, (arg1[0]),
                                                      (arg2[0]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x3, &x4, x2, (arg1[1]),
                                                      (arg2[1]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x5, &x6, x4, (arg1[2]),
                                                      (arg2[2]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x7, &x8, x6, (arg1[3]),
                                                      (arg2[3]));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x9, &x10, 0x0, x1,
                                                       UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x11, &x12, x10, x3,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x13, &x14, x12, x5,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(
        &x15, &x16, x14, x7, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x17, &x18, x16, x8,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x19, x18, x9, x1);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x20, x18, x11, x3);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x21, x18, x13, x5);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x22, x18, x15, x7);
    out1[0] = x19;
    out1[1] = x20;
    out1[2] = x21;
    out1[3] = x22;
}